

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O0

void __thiscall NaPNSum::NaPNSum(NaPNSum *this,char *szNodeName)

{
  NaPetriCnInput *in_RDI;
  char *in_stack_000003e8;
  NaPetriNode *in_stack_000003f0;
  uint n;
  char *in_stack_ffffffffffffffc0;
  NaPetriCnInput *this_00;
  NaPetriNode *in_stack_ffffffffffffffc8;
  NaPetriNode *pHost;
  NaPetriCnOutput *in_stack_ffffffffffffffe0;
  
  NaPetriNode::NaPetriNode(in_stack_000003f0,in_stack_000003e8);
  (in_RDI->super_NaPetriConnector)._vptr_NaPetriConnector = (_func_int **)&PTR__NaPNSum_00195a08;
  pHost = (NaPetriNode *)(in_RDI + 1);
  NaPetriCnInput::NaPetriCnInput(in_RDI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  NaPetriCnInput::NaPetriCnInput(in_RDI,(NaPetriNode *)(in_RDI + 2),in_stack_ffffffffffffffc0);
  this_00 = in_RDI + 3;
  NaPetriCnOutput::NaPetriCnOutput(in_stack_ffffffffffffffe0,pHost,(char *)in_RDI);
  n = (uint)((ulong)&in_RDI[4].super_NaPetriConnector.dfTrace >> 0x20);
  NaVector::NaVector((NaVector *)this_00,n);
  NaVector::NaVector((NaVector *)this_00,n);
  return;
}

Assistant:

NaPNSum::NaPNSum (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  main(this, "main"),
  aux(this, "aux"),
  sum(this, "sum")
{
    // Nothing to do
}